

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O2

Belief * __thiscall despot::RegDemo::InitialBelief(RegDemo *this,State *start,string type)

{
  ParticleBelief *pPVar1;
  int i;
  int iVar2;
  State *local_60;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_38;
  
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
    local_60 = (State *)(**(code **)(*(long *)this + 0xa8))(0,this,iVar2);
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)&particles,&local_60);
  }
  pPVar1 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_38,&particles);
  despot::ParticleBelief::ParticleBelief(pPVar1,&local_38,this,0,1);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_38);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  return (Belief *)pPVar1;
}

Assistant:

Belief* RegDemo::InitialBelief(const State* start, string type) const {
	vector<State*> particles;
	for (int i = 0; i < 2; i++)
		particles.push_back(static_cast<RegDemoState*>(Allocate(i, 0.5)));

	Belief* belief = new ParticleBelief(particles, this);
	return belief;
}